

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

char * duckdb_fmt::v6::internal::sprintf_format<double>
                 (double value,buffer<char> *buf,sprintf_specs specs)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  _func_int **pp_Var4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  char format [10];
  char local_52 [10];
  ulong local_48;
  byte *local_40;
  double local_38;
  
  uVar9 = (ulong)specs >> 0x20;
  local_52[0] = '%';
  bVar8 = specs.type;
  if (((ulong)specs >> 0x28 & 1) == 0 && bVar8 != 0) {
    pbVar3 = (byte *)(local_52 + 1);
  }
  else {
    pbVar3 = (byte *)(local_52 + 2);
    local_52[1] = 0x23;
  }
  if (-1 < specs.precision) {
    pbVar3[0] = 0x2e;
    pbVar3[1] = 0x2a;
    pbVar3 = pbVar3 + 2;
  }
  bVar6 = bVar8;
  if (bVar8 == 0x6e) {
    bVar6 = 0x67;
  }
  if (bVar8 == 0) {
    bVar6 = 0x67;
  }
  bVar7 = 0x66;
  if (bVar8 != 0x25) {
    bVar7 = bVar6;
  }
  *pbVar3 = bVar7;
  pbVar3[1] = 0;
  local_40 = (byte *)0x0;
  local_38 = value;
  do {
    uVar2 = format_float<double>(buf->ptr_,buf->capacity_,local_52,specs.precision,local_38);
    if ((int)uVar2 < 0) {
      bVar1 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        uVar11 = buf->capacity_ + 1;
        pp_Var4 = buf->_vptr_buffer;
LAB_01c9752c:
        (**pp_Var4)(buf,uVar11);
      }
    }
    else {
      uVar11 = (ulong)uVar2;
      uVar12 = buf->capacity_;
      bVar1 = uVar12 <= uVar11;
      if (uVar11 < uVar12) {
        pbVar3 = (byte *)buf->ptr_;
        if ((*pbVar3 == 0x2d) || (pbVar10 = pbVar3, *pbVar3 == 0x2b)) {
          pbVar10 = pbVar3 + 1;
        }
        if (((bVar8 & 0xdf) != 0x41) && (pbVar3 = pbVar3 + uVar11, pbVar10 < pbVar3)) {
LAB_01c97565:
          pbVar5 = pbVar10 + 1;
          if ((byte)(*pbVar10 - 0x30) < 10) break;
          if (((*pbVar10 | 0x20) != 0x65) && (local_40 = pbVar10, (char)uVar9 == '\0')) {
            pbVar10 = pbVar10 + 2;
            if (*pbVar5 != 0x30) {
              pbVar10 = pbVar5;
            }
            for (; (pbVar10 != pbVar3 && ((byte)(*pbVar10 - 0x31) < 9)); pbVar10 = pbVar10 + 1) {
            }
            bVar13 = pbVar10 == pbVar3;
            pbVar5 = pbVar10;
            local_48 = uVar9;
            if (bVar13) {
LAB_01c975f0:
              uVar2 = uVar2 + ((int)pbVar10 - (int)pbVar5);
              uVar9 = local_48;
            }
            else {
              bVar6 = *pbVar10;
              while (bVar6 == 0x30) {
                pbVar5 = pbVar5 + 1;
                bVar13 = pbVar5 == pbVar3;
                if (bVar13) goto LAB_01c975f0;
                bVar6 = *pbVar5;
              }
              if (bVar13) goto LAB_01c975f0;
              if ((byte)(*pbVar5 - 0x3a) < 0xf6) {
                memmove(pbVar10,pbVar5,(long)pbVar3 - (long)pbVar5);
                goto LAB_01c975f0;
              }
            }
          }
        }
LAB_01c975fb:
        uVar12 = (ulong)uVar2;
        if (buf->capacity_ < uVar12) {
          (**buf->_vptr_buffer)(buf,uVar12);
        }
        buf->size_ = uVar12;
      }
      else {
        uVar11 = (ulong)(uVar2 + 1);
        if (uVar12 < uVar11) {
          pp_Var4 = buf->_vptr_buffer;
          goto LAB_01c9752c;
        }
      }
    }
    if (!bVar1) {
      return (char *)local_40;
    }
  } while( true );
  pbVar10 = pbVar5;
  if (pbVar3 <= pbVar5) goto LAB_01c975fb;
  goto LAB_01c97565;
}

Assistant:

char* sprintf_format(Double value, internal::buffer<char>& buf,
                     sprintf_specs specs) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { max_format_size = 10 };  // longest format: %#-*.*Lg
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.alt || !specs.type) *format_ptr++ = '#';
  if (specs.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value) *format_ptr++ = 'L';

  char type = specs.type;

  if (type == '%')
    type = 'f';
  else if (type == 0 || type == 'n')
    type = 'g';
#if FMT_MSC_VER
  if (type == 'F') {
    // MSVC's printf doesn't support 'F'.
    type = 'f';
  }
#endif
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  char* start = nullptr;
  char* decimal_point_pos = nullptr;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result =
        format_float(start, buffer_size, format, specs.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        // Find the decimal point.
        auto p = buf.data(), end = p + n;
        if (*p == '+' || *p == '-') ++p;
        if (specs.type != 'a' && specs.type != 'A') {
          while (p < end && *p >= '0' && *p <= '9') ++p;
          if (p < end && *p != 'e' && *p != 'E') {
            decimal_point_pos = p;
            if (!specs.type) {
              // Keep only one trailing zero after the decimal point.
              ++p;
              if (*p == '0') ++p;
              while (p != end && *p >= '1' && *p <= '9') ++p;
              char* where = p;
              while (p != end && *p == '0') ++p;
              if (p == end || *p < '0' || *p > '9') {
                if (p != end) std::memmove(where, p, to_unsigned(end - p));
                n -= static_cast<unsigned>(p - where);
              }
            }
          }
        }
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
  return decimal_point_pos;
}